

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_selectable_symbol
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *str,int len,
              nk_flags align,int *value,nk_symbol_type sym,nk_style_selectable *style,nk_input *in,
              nk_user_font *font)

{
  float fVar1;
  int iVar2;
  nk_rect r;
  int iVar3;
  float fVar4;
  undefined8 uVar5;
  float local_88;
  undefined1 local_84 [8];
  nk_rect icon;
  nk_rect touch;
  int old_value;
  int *value_local;
  nk_flags align_local;
  int len_local;
  char *str_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_30;
  nk_rect bounds_local;
  
  uVar5 = bounds._8_8_;
  register0x00001200 = bounds._0_8_;
  bounds_local._0_8_ = uVar5;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5072,
                  "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5073,
                  "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5074,
                  "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (len == 0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5075,
                  "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (value == (int *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5076,
                  "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_selectable *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5077,
                  "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5078,
                  "int nk_do_selectable_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, enum nk_symbol_type, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if ((((state == (nk_flags *)0x0) || (out == (nk_command_buffer *)0x0)) || (str == (char *)0x0)) ||
     (((len == 0 || (value == (int *)0x0)) ||
      ((style == (nk_style_selectable *)0x0 || (font == (nk_user_font *)0x0)))))) {
    bounds_local.w = 0.0;
  }
  else {
    iVar2 = *value;
    state_local._4_4_ = bounds.x;
    icon.w = state_local._4_4_ - (style->touch_padding).x;
    fStack_30 = bounds.y;
    icon.h = fStack_30 - (style->touch_padding).y;
    bounds_local.x = bounds.w;
    fVar4 = (style->touch_padding).x;
    bounds_local.y = bounds.h;
    fVar1 = (style->touch_padding).y;
    r.y = icon.h;
    r.x = icon.w;
    r.w = fVar4 + fVar4 + bounds_local.x;
    r.h = fVar1 + fVar1 + bounds_local.y;
    iVar3 = nk_button_behavior(state,r,in,NK_BUTTON_DEFAULT);
    if (iVar3 != 0) {
      *value = (uint)((*value != 0 ^ 0xffU) & 1);
    }
    fVar4 = (style->padding).y;
    fVar4 = bounds_local.y - (fVar4 + fVar4);
    if ((align & 1) == 0) {
      fVar1 = (style->padding).x;
      local_84._0_4_ = fVar1 + fVar1 + state_local._4_4_;
    }
    else {
      fVar1 = (style->padding).x;
      local_88 = (state_local._4_4_ + bounds_local.x) - (fVar1 + fVar1 + fVar4);
      if (local_88 < 0.0) {
        local_88 = 0.0;
      }
      local_84._0_4_ = local_88;
    }
    local_84._0_4_ = (style->image_padding).x + (float)local_84._0_4_;
    local_84._4_4_ = (style->image_padding).y + fStack_30 + (style->padding).y;
    fVar1 = (style->image_padding).x;
    icon.x = fVar4 - (fVar1 + fVar1);
    fVar1 = (style->image_padding).y;
    icon.y = fVar4 - (fVar1 + fVar1);
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_selectable(out,*state,style,*value,(nk_rect *)((long)&state_local + 4),
                       (nk_rect *)local_84,(nk_image *)0x0,sym,str,len,align,font);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
    bounds_local.w = (float)(uint)(iVar2 != *value);
  }
  return (int)bounds_local.w;
}

Assistant:

NK_LIB int
nk_do_selectable_symbol(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, const char *str, int len, nk_flags align, int *value,
    enum nk_symbol_type sym, const struct nk_style_selectable *style,
    const struct nk_input *in, const struct nk_user_font *font)
{
    int old_value;
    struct nk_rect touch;
    struct nk_rect icon;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(str);
    NK_ASSERT(len);
    NK_ASSERT(value);
    NK_ASSERT(style);
    NK_ASSERT(font);

    if (!state || !out || !str || !len || !value || !style || !font) return 0;
    old_value = *value;

    /* toggle behavior */
    touch.x = bounds.x - style->touch_padding.x;
    touch.y = bounds.y - style->touch_padding.y;
    touch.w = bounds.w + style->touch_padding.x * 2;
    touch.h = bounds.h + style->touch_padding.y * 2;
    if (nk_button_behavior(state, touch, in, NK_BUTTON_DEFAULT))
        *value = !(*value);

    icon.y = bounds.y + style->padding.y;
    icon.w = icon.h = bounds.h - 2 * style->padding.y;
    if (align & NK_TEXT_ALIGN_LEFT) {
        icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
        icon.x = NK_MAX(icon.x, 0);
    } else icon.x = bounds.x + 2 * style->padding.x;

    icon.x += style->image_padding.x;
    icon.y += style->image_padding.y;
    icon.w -= 2 * style->image_padding.x;
    icon.h -= 2 * style->image_padding.y;

    /* draw selectable */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_selectable(out, *state, style, *value, &bounds, &icon, 0, sym, str, len, align, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return old_value != *value;
}